

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_compileASTNode
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler_,
          sysbvm_tuple_t astNode_)

{
  sysbvm_functionBytecodeAssembler_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_functionBytecodeDirectCompiler_t *local_70;
  ulong local_68;
  sysbvm_tuple_t local_60;
  sysbvm_tuple_t sStack_58;
  sysbvm_tuple_t local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_functionBytecodeDirectCompiler_t **ppsStack_30;
  ulong local_28;
  sysbvm_functionBytecodeDirectCompiler_t *local_20;
  
  ppsStack_30 = &local_70;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  local_70 = compiler_;
  local_68 = astNode_;
  sysbvm_stackFrame_pushRecord(&local_48);
  psVar1 = local_70->assembler;
  sStack_58 = psVar1->sourcePosition;
  local_50 = psVar1->sourceASTNode;
  if ((local_68 & 0xf) == 0 && local_68 != 0) {
    sVar2 = *(sysbvm_tuple_t *)(local_68 + 0x10);
  }
  else {
    sVar2 = 0;
  }
  psVar1->sourcePosition = sVar2;
  psVar1->sourceASTNode = local_68;
  local_28 = local_68;
  local_20 = local_70;
  local_60 = sysbvm_tuple_send(context,(context->roots).astNodeCompileIntoBytecodeSelector,2,
                               &local_28,0);
  psVar1 = local_70->assembler;
  psVar1->sourcePosition = sStack_58;
  psVar1->sourceASTNode = local_50;
  sysbvm_stackFrame_popRecord(&local_48);
  return local_60;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_compileASTNode(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler_, sysbvm_tuple_t astNode_)
{
    struct {
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t result;

        sysbvm_tuple_t oldSourcePosition;
        sysbvm_tuple_t oldSourceASTNode;
    } gcFrame = {
        .compiler = compiler_,
        .astNode = astNode_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.oldSourcePosition = gcFrame.compiler->assembler->sourcePosition;
    gcFrame.oldSourceASTNode = gcFrame.compiler->assembler->sourceASTNode;

    gcFrame.compiler->assembler->sourcePosition = sysbvm_astNode_getSourcePosition(gcFrame.astNode);
    gcFrame.compiler->assembler->sourceASTNode = gcFrame.astNode;

    gcFrame.result = sysbvm_tuple_send1(context, context->roots.astNodeCompileIntoBytecodeSelector, gcFrame.astNode, (sysbvm_tuple_t)gcFrame.compiler);

    gcFrame.compiler->assembler->sourcePosition = gcFrame.oldSourcePosition;
    gcFrame.compiler->assembler->sourceASTNode = gcFrame.oldSourceASTNode;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}